

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  bool bVar1;
  bool bVar2;
  truncated_hash_type tVar3;
  size_type bucket_count;
  key_type *key;
  size_t ibucket;
  value_type *ppoVar4;
  size_t local_e0;
  KeySelect local_a9;
  size_t local_a8;
  size_t hash;
  bucket_entry<objc_selector_*,_true> *bucket;
  iterator __end0;
  iterator __begin0;
  buckets_container_type *__range3;
  bool use_stored_hash;
  undefined1 local_69;
  undefined1 local_68 [8];
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  size_type count__local;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *this_local;
  
  new_table._72_8_ = count_;
  get_allocator((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *)&local_69);
  robin_hash((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)local_68,count_,(SelectorHash *)this,(SelectorEqual *)this,
             (allocator<objc_selector_*> *)&local_69,this->m_min_load_factor,this->m_max_load_factor
            );
  std::allocator<objc_selector_*>::~allocator((allocator<objc_selector_*> *)&local_69);
  bucket_count = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::bucket_count((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)local_68);
  bVar1 = USE_STORED_HASH_ON_REHASH(bucket_count);
  __end0 = std::
           vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
           ::begin(&this->m_buckets_data);
  bucket = (bucket_entry<objc_selector_*,_true> *)
           std::
           vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
           ::end(&this->m_buckets_data);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>_>
                                     *)&bucket), bVar2) {
    hash = (size_t)__gnu_cxx::
                   __normal_iterator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>_>
                   ::operator*(&__end0);
    bVar2 = bucket_entry<objc_selector_*,_true>::empty((bucket_entry<objc_selector_*,_true> *)hash);
    if (!bVar2) {
      if (bVar1) {
        tVar3 = bucket_entry_hash<true>::truncated_hash((bucket_entry_hash<true> *)hash);
        local_e0 = (size_t)tVar3;
      }
      else {
        ppoVar4 = bucket_entry<objc_selector_*,_true>::value
                            ((bucket_entry<objc_selector_*,_true> *)hash);
        key = robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              ::KeySelect::operator()(&local_a9,ppoVar4);
        local_e0 = robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::hash_key<objc_selector*>
                             ((robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)local_68,key);
      }
      local_a8 = local_e0;
      ibucket = bucket_for_hash((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)local_68,local_e0);
      tVar3 = bucket_entry<objc_selector_*,_true>::truncate_hash(local_a8);
      ppoVar4 = bucket_entry<objc_selector_*,_true>::value
                          ((bucket_entry<objc_selector_*,_true> *)hash);
      insert_value_on_rehash
                ((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *)local_68,ibucket,0,tVar3,ppoVar4);
    }
    __gnu_cxx::
    __normal_iterator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>_>
    ::operator++(&__end0);
  }
  new_table.m_bucket_count = this->m_nb_elements;
  swap((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
        *)local_68,this);
  ~robin_hash((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *)local_68);
  return;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }